

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O0

void __thiscall
TPZReducedSpace::ReallyComputeSolution(TPZReducedSpace *this,TPZMaterialDataT<double> *data)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TPZBaseMatrix *this_00;
  TPZVec<TPZManVector<double,_10>_> *this_01;
  TPZVec<TPZFNMatrix<30,_double>_> *this_02;
  int64_t iVar5;
  undefined4 extraout_var;
  TPZCompMesh *pTVar6;
  TPZFMatrix<double> *this_03;
  int64_t iVar7;
  TPZManVector<double,_10> *pTVar8;
  TPZFNMatrix<30,_double> *pTVar9;
  undefined4 extraout_var_00;
  double *pdVar10;
  long in_RSI;
  TPZFMatrix<double> *in_RDI;
  double col;
  double dVar11;
  int64_t id;
  int64_t iv;
  int64_t is_1;
  int ib;
  int64_t pos;
  int dfvar;
  int64_t dfseq;
  TPZConnect *df;
  TPZBlock *block;
  int64_t is;
  int64_t numberdof;
  int64_t numbersol;
  TPZFMatrix<double> *MeshSol;
  int nsol;
  int nstate;
  int dim;
  TPZGradSolVec<STATE> *dsol;
  TPZSolVec<STATE> *sol;
  TPZFMatrix<double> *axes;
  TPZFMatrix<double> *dphix;
  TPZFMatrix<double> *phi;
  TPZCompEl *in_stack_00000100;
  int in_stack_ffffffffffffff1c;
  TPZSolutionMatrix *in_stack_ffffffffffffff20;
  double col_00;
  double in_stack_ffffffffffffff38;
  long local_b8;
  long local_b0;
  int64_t in_stack_ffffffffffffff58;
  long index;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  double *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  long local_68;
  
  this_00 = (TPZBaseMatrix *)(in_RSI + 0x3900);
  this_01 = (TPZVec<TPZManVector<double,_10>_> *)(in_RSI + 0x48d0);
  this_02 = (TPZVec<TPZFNMatrix<30,_double>_> *)(in_RSI + 0x51b0);
  iVar5 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x3f20));
  iVar2 = (int)iVar5;
  iVar3 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x17])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x78))();
  iVar5 = TPZBaseMatrix::Rows(this_00);
  pTVar6 = TPZCompEl::Mesh(in_stack_00000100);
  TPZCompMesh::Solution(pTVar6);
  this_03 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff20);
  iVar7 = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_03);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)this_03);
  (*this_01->_vptr_TPZVec[3])(this_01,iVar7);
  (*this_02->_vptr_TPZVec[3])(this_02,iVar7);
  for (local_68 = 0; local_68 < iVar7; local_68 = local_68 + 1) {
    pTVar8 = TPZVec<TPZManVector<double,_10>_>::operator[](this_01,local_68);
    (*(pTVar8->super_TPZVec<double>)._vptr_TPZVec[3])(pTVar8,(long)iVar3);
    TPZVec<TPZManVector<double,_10>_>::operator[](this_01,local_68);
    TPZVec<double>::Fill
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    pTVar9 = TPZVec<TPZFNMatrix<30,_double>_>::operator[](this_02,local_68);
    (*(pTVar9->super_TPZFMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0xe])(pTVar9,(long)iVar2,(long)iVar3);
  }
  pTVar6 = TPZCompEl::Mesh(in_stack_00000100);
  TPZCompMesh::Block(pTVar6);
  iVar4 = (*(in_RDI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x15])(in_RDI,0);
  TPZConnect::SequenceNumber((TPZConnect *)CONCAT44(extraout_var_00,iVar4));
  TPZBlock::Size((TPZBlock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  TPZBlock::Position((TPZBlock *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  for (iVar4 = 0; iVar4 < (int)iVar5; iVar4 = iVar4 + 1) {
    for (index = 0; index < iVar7; index = index + 1) {
      for (local_b0 = 0; local_b0 < iVar3; local_b0 = local_b0 + 1) {
        (*(this_00->super_TPZSavable)._vptr_TPZSavable[0x24])(this_00,(long)iVar4,local_b0);
        col_00 = col;
        pdVar10 = TPZFMatrix<double>::operator()
                            (in_RDI,(int64_t)in_stack_ffffffffffffff38,(int64_t)col);
        in_stack_ffffffffffffff38 = *pdVar10;
        pTVar8 = TPZVec<TPZManVector<double,_10>_>::operator[](this_01,index);
        pdVar10 = TPZVec<double>::operator[](&pTVar8->super_TPZVec<double>,local_b0 % (long)iVar3);
        *pdVar10 = col_00 * in_stack_ffffffffffffff38 + *pdVar10;
        for (local_b8 = 0; local_b8 < iVar2; local_b8 = local_b8 + 1) {
          dVar11 = (double)(**(code **)(*(long *)(in_RSI + 0x3a38) + 0x120))
                                     ((long *)(in_RSI + 0x3a38),local_b8 + local_b0 * iVar2,
                                      (long)iVar4);
          pdVar10 = TPZFMatrix<double>::operator()
                              (in_RDI,(int64_t)in_stack_ffffffffffffff38,(int64_t)col_00);
          dVar1 = *pdVar10;
          TPZVec<TPZFNMatrix<30,_double>_>::operator[](this_02,index);
          pdVar10 = TPZFMatrix<double>::operator()
                              (in_RDI,(int64_t)in_stack_ffffffffffffff38,(int64_t)col_00);
          *pdVar10 = dVar11 * dVar1 + *pdVar10;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZReducedSpace::ReallyComputeSolution(TPZMaterialDataT<STATE>& data)
{
    const TPZFMatrix<REAL> &phi = data.phi;
    const TPZFMatrix<REAL> &dphix = data.dphix;
    const TPZFMatrix<REAL> &axes = data.axes;
    TPZSolVec<STATE> &sol = data.sol;
    TPZGradSolVec<STATE> &dsol = data.dsol;
    const int dim = axes.Rows();//this->Reference()->Dimension();
    const int nstate = this->Material()->NStateVariables();
    
#ifdef PZDEBUG
    const int ncon = this->NConnects();
    if (ncon != 1) {
        DebugStop();
    }
#endif
    
//    TPZInterpolationSpace *intel = ReferredIntel();
//    TPZSolVec sol_t;
//    TPZGradSolVec dsol_t;
//    TPZFMatrix<REAL> axes_t = axes;
//    intel->ComputeSolution(qsi, sol_t, dsol_t, axes_t);
    
    int nsol = phi.Rows();//sol_t.size();
//    int numdof = sol_t[0].size();
//    int dim = axes_t.Rows();
    
    TPZFMatrix<STATE> &MeshSol = Mesh()->Solution();
    int64_t numbersol = MeshSol.Cols();
    int64_t numberdof = MeshSol.Rows();
    sol.Resize(numbersol);
    dsol.Resize(numbersol);
	
    for (int64_t is=0 ; is<numbersol; is++) {
        sol[is].Resize(nstate);
        sol[is].Fill(0.);
        dsol[is].Redim(dim, nstate);
    }
    
    TPZBlock &block = Mesh()->Block();
    TPZConnect *df = &this->Connect(0);
    int64_t dfseq = df->SequenceNumber();
    int dfvar = block.Size(dfseq);
    int64_t pos = block.Position(dfseq);
    
#ifdef PZDEBUG
    {
        if(nsol * nstate != dfvar)
        {
            DebugStop();
        }
        
    }
    
    
#endif
    
    for(int ib=0; ib < nsol; ib++) {

        for (int64_t is=0; is<numbersol; is++) {
            
            for(int64_t iv = 0; iv < nstate; iv++){
                sol[is][iv%nstate] += (STATE)phi.GetVal(ib,iv)*MeshSol(pos+ib*nstate+iv,is);
                
                for(int64_t id = 0; id < dim; id++){
                    dsol[is](id,iv%nstate) += (STATE)dphix.GetVal(id+iv*dim,ib)*MeshSol(pos+ib*nstate+iv,is);
                }
            }
        }
    }
    
}